

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaAllocator_T::~VmaAllocator_T(VmaAllocator_T *this)

{
  VmaBlockVector *this_00;
  PFN_vkFreeFunction p_Var1;
  ulong uVar2;
  
  for (uVar2 = (ulong)(this->m_MemProps).memoryTypeCount; uVar2 != 0; uVar2 = uVar2 - 1) {
    this_00 = this->m_pBlockVectors[uVar2 - 1];
    if (this_00 != (VmaBlockVector *)0x0) {
      VmaBlockVector::~VmaBlockVector(this_00);
      p_Var1 = (this->m_AllocationCallbacks).pfnFree;
      if (p_Var1 == (PFN_vkFreeFunction)0x0) {
        free(this_00);
      }
      else {
        (*p_Var1)((this->m_AllocationCallbacks).pUserData,this_00);
      }
    }
  }
  VmaPoolAllocator<VmaAllocation_T>::~VmaPoolAllocator
            (&(this->m_AllocationObjectAllocator).m_Allocator);
  return;
}

Assistant:

VmaAllocator_T::~VmaAllocator_T()
{
    VMA_ASSERT(m_Pools.IsEmpty());

    for(size_t memTypeIndex = GetMemoryTypeCount(); memTypeIndex--; )
    {
        vma_delete(this, m_pBlockVectors[memTypeIndex]);
    }
}